

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

double SoapySDRDevice_getGainElement(SoapySDRDevice *device,int direction,size_t channel,char *name)

{
  char *in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  exception *ex;
  allocator local_49;
  string local_48 [32];
  char *local_28;
  undefined8 local_20;
  undefined4 local_14;
  long *local_10;
  double local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  SoapySDRDevice_clearError();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,local_28,&local_49);
  local_8 = (double)(**(code **)(*local_10 + 0x1a0))(local_10,local_14,local_20,local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return local_8;
}

Assistant:

double SoapySDRDevice_getGainElement(const SoapySDRDevice *device, const int direction, const size_t channel, const char *name)
{
    __SOAPY_SDR_C_TRY
    return device->getGain(direction, channel, name);
    __SOAPY_SDR_C_CATCH_RET(NAN);
}